

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void handle_2misc_reciprocal
               (DisasContext_conflict1 *s,int opcode,_Bool is_scalar,_Bool is_u,_Bool is_q,int size,
               int rn,int rd)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar1;
  bool bVar2;
  TCGTemp *pTVar3;
  TCGTemp *ret;
  uint uVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  bool bVar5;
  TCGv_i64 ret_00;
  ulong uVar6;
  TCGArg a3;
  int line;
  code *pcVar7;
  undefined7 in_register_00000081;
  TCGArg a3_00;
  TCGTemp *local_78;
  TCGv_i64 local_70;
  uint local_5c;
  TCGTemp *local_58;
  uint local_4c;
  TCGv_i32 local_48;
  ulong local_40;
  TCGv_i64 local_38;
  
  local_4c = (uint)CONCAT71(in_register_00000009,is_u);
  local_5c = (uint)CONCAT71(in_register_00000011,is_scalar);
  s_00 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar3 - (long)s_00);
  tcg_gen_addi_i64_aarch64(s_00,ret_00,(TCGv_i64)s_00->cpu_env,0x2ec8);
  local_38 = ret_00;
  if ((int)CONCAT71(in_register_00000081,is_q) == 3) {
    bVar5 = false;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    local_48 = (TCGv_i32)((long)pTVar3 - (long)s_00);
    local_58 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    local_40 = (long)local_58 - (long)s_00;
    uVar6 = 0;
    do {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)(local_48 + (long)&pTVar1->pool_cur),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (long)(size * 0x100 + (int)uVar6 + 0xc10));
      if (opcode == 0x7d) {
        pcVar7 = helper_rsqrte_f64_aarch64;
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f64_aarch64;
      }
      else {
        if (opcode != 0x3d) {
          line = 0x26df;
LAB_006b5c07:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,line,(char *)0x0);
        }
        pcVar7 = helper_recpe_f64_aarch64;
      }
      local_78 = pTVar3;
      local_70 = (TCGv_i64)((long)s_00 + (long)ret_00);
      tcg_gen_callN_aarch64(s_00,pcVar7,local_58,2,&local_78);
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(long)&pTVar1->pool_cur + local_40,
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          uVar6 | (long)(rn * 0x100 + 0xc10));
      uVar6 = 8;
      bVar2 = !bVar5;
      bVar5 = true;
    } while (bVar2 && (local_5c & 1) == 0);
    tcg_temp_free_internal_aarch64(s_00,local_58);
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    uVar4 = (uint)(byte)((byte)local_5c ^ 1);
  }
  else {
    uVar6 = 0;
    pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    local_58 = (TCGTemp *)((long)pTVar3 - (long)s_00);
    ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    local_48 = (TCGv_i32)((long)ret - (long)s_00);
    a3_00 = (TCGArg)(rn * 0x100 + 0xc10);
    local_40 = (ulong)(byte)local_4c * 2 + 2;
    a3 = (long)(size * 0x100 + 0xc00) | 0x10;
    do {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i32,
                          (TCGArg)(&local_58->field_0x0 + (long)&pTVar1->pool_cur),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),a3);
      if (opcode < 0x3f) {
        if (opcode == 0x3c) {
          pcVar7 = helper_recpe_u32_aarch64;
        }
        else {
          if (opcode != 0x3d) {
LAB_006b5bfb:
            line = 0x2702;
            goto LAB_006b5c07;
          }
          pcVar7 = helper_recpe_f32_aarch64;
        }
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f32_aarch64;
      }
      else {
        if (opcode != 0x7d) goto LAB_006b5bfb;
        pcVar7 = helper_rsqrte_f32_aarch64;
      }
      local_78 = pTVar3;
      local_70 = (TCGv_i64)((long)s_00 + (long)ret_00);
      tcg_gen_callN_aarch64(s_00,pcVar7,ret,2,&local_78);
      if ((char)local_5c != '\0') {
        write_fp_sreg(s,rn,local_48);
        break;
      }
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i32,(TCGArg)(local_48 + (long)&pTVar1->pool_cur),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),a3_00);
      uVar6 = uVar6 + 1;
      a3 = a3 + 4;
      a3_00 = a3_00 + 4;
    } while (uVar6 < local_40);
    tcg_temp_free_internal_aarch64(s_00,ret);
    tcg_temp_free_internal_aarch64(s_00,pTVar3);
    uVar4 = local_4c;
    if ((char)local_5c != '\0') goto LAB_006b5bce;
  }
  clear_vec_high((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,SUB81(s->uc->tcg_ctx,0),
                 uVar4 & 0xff);
LAB_006b5bce:
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(local_38 + (long)s_00));
  return;
}

Assistant:

static void handle_2misc_reciprocal(DisasContext *s, int opcode,
                                    bool is_scalar, bool is_u, bool is_q,
                                    int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_double = (size == 3);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

    if (is_double) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);
        int pass;

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
            switch (opcode) {
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }
            write_vec_element(s, tcg_res, rd, pass, MO_64);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_op);
        clear_vec_high(s, !is_scalar, rd);
    } else {
        TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        for (pass = 0; pass < maxpasses; pass++) {
            read_vec_element_i32(s, tcg_op, rn, pass, MO_32);

            switch (opcode) {
            case 0x3c: /* URECPE */
                gen_helper_recpe_u32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }
        }
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_op);
        if (!is_scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
    tcg_temp_free_ptr(tcg_ctx, fpst);
}